

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O2

int png_get_data(png_t *png,uchar *data)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uchar *puVar9;
  undefined8 *puVar10;
  size_t sVar11;
  void *in_RCX;
  void *pvVar12;
  uchar *puVar13;
  uchar *prev_line;
  uchar *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong in_R8;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long in_FS_OFFSET;
  void *pvStack_70;
  void *local_60;
  uint local_4c;
  uint type;
  uint local_44;
  uint length;
  uint type_1;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  png->png_data = (uchar *)0x0;
  png->zs = (void *)0x0;
  iVar20 = 0;
LAB_0019e3bf:
  iVar19 = -1;
  if (iVar20 == 0) {
    file_read_ul(png,&local_4c);
    sVar8 = file_read(png,&type,4,(size_t)in_RCX);
    iVar20 = iVar19;
    if (sVar8 == 4) {
      pvStack_70 = (void *)0x1;
      pvVar12 = (void *)0x1;
      in_RCX = pvStack_70;
      iVar20 = 1;
      if (type != 0x444e4549) {
        if (type == 0x54414449) {
          in_RCX = pvVar12;
          iVar20 = iVar19;
          if (png->png_data == (uchar *)0x0) {
            uVar16 = (uint)png->bpp * png->width * png->height + png->height;
            png->png_datalen = uVar16;
            puVar9 = (uchar *)(*png_alloc)((ulong)uVar16);
            uVar16 = local_4c;
            png->png_data = puVar9;
            in_RCX = (void *)0xfffffffffffffffa;
            iVar20 = -6;
            if (puVar9 != (uchar *)0x0) {
              sVar8 = (size_t)local_4c;
              type_1 = 0;
              length = local_4c;
              local_60 = (*png_alloc)(sVar8);
              iVar20 = -6;
              if (local_60 != (void *)0x0) {
                puVar10 = (undefined8 *)(*png_alloc)(0x70);
                png->zs = puVar10;
                iVar20 = -6;
                if (puVar10 != (undefined8 *)0x0) {
                  puVar10[0xc] = 0;
                  puVar10[0xd] = 0;
                  puVar10[10] = 0;
                  puVar10[0xb] = 0;
                  puVar10[8] = 0;
                  puVar10[9] = 0;
                  puVar10[6] = 0;
                  puVar10[7] = 0;
                  puVar10[4] = 0;
                  puVar10[5] = 0;
                  puVar10[2] = 0;
                  puVar10[3] = 0;
                  *puVar10 = 0;
                  puVar10[1] = 0;
                  iVar4 = inflateInit_(puVar10,"1.2.11",0x70);
                  in_RCX = (void *)0xfffffffffffffff9;
                  iVar20 = -7;
                  if (iVar4 == 0) {
                    puVar10[3] = png->png_data;
                    *(uint *)(puVar10 + 4) = png->png_datalen;
                    do {
                      sVar8 = file_read(png,local_60,sVar8,(size_t)in_RCX);
                      uVar18 = (ulong)length;
                      if (sVar8 != uVar18) {
                        png_end_inflate(png);
                        (*png_free)(local_60);
                        iVar20 = iVar19;
                        goto LAB_0019e3bf;
                      }
                      uVar5 = crc32(0,0,0);
                      uVar5 = crc32(uVar5,"IDAT",4);
                      uVar6 = crc32(uVar5,local_60,uVar18);
                      file_read_ul(png,&local_44);
                      if (local_44 != uVar6) {
                        iVar19 = -5;
                        goto LAB_0019e66b;
                      }
                      puVar10 = (undefined8 *)png->zs;
                      if (puVar10 == (undefined8 *)0x0) {
                        iVar19 = -6;
                        goto LAB_0019e66b;
                      }
                      *puVar10 = local_60;
                      *(uint *)(puVar10 + 1) = length;
                      in_RCX = local_60;
                      uVar6 = inflate(puVar10,2);
                      if (1 < uVar6) {
                        __printf_chk(1,"%s\n",puVar10[6]);
LAB_0019e660:
                        iVar19 = -7;
                        goto LAB_0019e66b;
                      }
                      if (*(int *)(puVar10 + 1) != 0) goto LAB_0019e660;
                      file_read_ul(png,&length);
                      sVar8 = (size_t)length;
                      if (uVar16 < length) {
                        (*png_free)(local_60);
                        uVar16 = length;
                        sVar8 = (size_t)length;
                        local_60 = (*png_alloc)(sVar8);
                        if (local_60 == (void *)0x0) {
                          png_end_inflate(png);
                          iVar20 = -6;
                          goto LAB_0019e3bf;
                        }
                      }
                      sVar11 = file_read(png,&type_1,4,(size_t)in_RCX);
                      if (sVar11 != 4) goto LAB_0019e66b;
                    } while (type_1 == 0x54414449);
                    iVar19 = 0;
LAB_0019e66b:
                    if (type_1 == 0x444e4549) {
                      iVar19 = 1;
                    }
                    (*png_free)(local_60);
                    png_end_inflate(png);
                    iVar20 = iVar19;
                    goto LAB_0019e3bf;
                  }
                }
                png_end_inflate(png);
                (*png_free)(local_60);
              }
            }
          }
        }
        else {
          file_read(png,(void *)0x0,(ulong)(local_4c + 4),1);
          in_RCX = pvVar12;
          iVar20 = 0;
        }
      }
    }
    goto LAB_0019e3bf;
  }
  if (iVar20 == 1) {
    puVar9 = png->png_data;
    bVar2 = png->bpp;
    iVar20 = 0;
    uVar18 = 0;
    uVar16 = 0;
    while (uVar16 < png->png_datalen) {
      uVar1 = (ulong)uVar16 + 1;
      uVar6 = (uint)bVar2;
      iVar19 = (int)uVar1;
      if (png->depth == '\x10') {
        uVar3 = png->width;
        for (uVar17 = 0; uVar17 < uVar3 * uVar6; uVar17 = uVar17 + 2) {
          in_R8 = (ulong)puVar9[(uint)((int)uVar17 + iVar19)] << 8;
          *(ushort *)(puVar9 + uVar17 + uVar1) =
               (ushort)puVar9[uVar16 + 2 + (int)uVar17] | (ushort)in_R8;
        }
      }
      if (4 < puVar9[uVar16]) {
        iVar20 = -8;
        break;
      }
      uVar17 = uVar1 & 0xffffffff;
      iVar4 = (int)uVar18;
      switch(puVar9[uVar16]) {
      case '\0':
        memcpy(data + uVar18,puVar9 + uVar17,(ulong)(png->width * uVar6));
        break;
      case '\x01':
        uVar16 = png->width * uVar6;
        uVar15 = 0;
        uVar17 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar17 = uVar15;
        }
        in_R8 = 0;
        for (; uVar17 != uVar15; uVar15 = uVar15 + 1) {
          if (bVar2 <= uVar15) {
            in_R8 = (ulong)data[uVar15 + (uVar18 - bVar2)];
          }
          data[uVar15 + uVar18] = puVar9[uVar15 + uVar1] + (char)in_R8;
        }
        break;
      case '\x02':
        if (iVar4 == 0) {
          prev_line = (uchar *)(ulong)(png->width * uVar6);
          puVar13 = (uchar *)0x0;
          puVar14 = data;
        }
        else {
          prev_line = (uchar *)(ulong)(png->width * uVar6);
          puVar13 = data + uVar18 + -(long)prev_line;
          puVar14 = data + uVar18;
        }
        png_filter_up(iVar19 + (int)puVar9,puVar14,puVar13,prev_line,(int)in_R8);
        break;
      case '\x03':
        if (iVar4 == 0) {
          in_R8 = (ulong)(png->width * (uint)bVar2);
          puVar13 = (uchar *)0x0;
          puVar14 = data;
        }
        else {
          in_R8 = (ulong)(png->width * (uint)bVar2);
          puVar13 = data + uVar18 + -in_R8;
          puVar14 = data + uVar18;
        }
        png_filter_average((uint)bVar2,puVar9 + uVar17,puVar14,puVar13,(int)in_R8);
        break;
      case '\x04':
        if (iVar4 == 0) {
          in_R8 = (ulong)(png->width * uVar6);
          puVar13 = (uchar *)0x0;
          puVar14 = data;
        }
        else {
          in_R8 = (ulong)(png->width * uVar6);
          puVar13 = data + uVar18 + -in_R8;
          puVar14 = data + uVar18;
        }
        png_filter_paeth((uint)bVar2,puVar9 + uVar17,puVar14,puVar13,(int)in_R8);
      }
      iVar7 = png->width * uVar6;
      uVar18 = (ulong)(uint)(iVar4 + iVar7);
      uVar16 = iVar7 + iVar19;
    }
    puVar9 = png->png_data;
  }
  else {
    if (png->png_data != (uchar *)0x0) goto LAB_0019e896;
    puVar9 = (uchar *)0x0;
  }
  (*png_free)(puVar9);
  png->png_data = (uchar *)0x0;
LAB_0019e896:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar20;
}

Assistant:

int png_get_data(png_t* png, unsigned char* data)
{
	int result = PNG_NO_ERROR;
	png->png_data = 0;
	png->zs = 0;

	while(result == PNG_NO_ERROR)
	{
		result = png_process_chunk(png);
	}

	if(result != PNG_DONE)
	{
		if(!png->png_data)
		{
			png_free(png->png_data);
			png->png_data = 0;
		}
		return result;
	}

	result = png_unfilter(png, data);

	png_free(png->png_data); 
	png->png_data = 0;

	return result;
}